

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

string * util::toLower(string *in)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  string *out;
  _func_int_int *in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  
  __last._M_current = in_RDI._M_current;
  std::__cxx11::string::string((string *)in_RDI._M_current);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)__last._M_current);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (in_stack_ffffffffffffffb8,__last,in_RDI,in_stack_ffffffffffffffa0);
  return (string *)in_RDI._M_current;
}

Assistant:

std::string toLower(const std::string& in) {
  std::string out;
  out.resize(in.size());
  std::transform(in.begin(), in.end(), out.begin(), ::tolower);
  return out;
}